

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O3

int Iso_ManCheckMapping(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vMap2to1,int fVerbose)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  
  if (pAig1->nObjs[2] != pAig2->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(pAig1) == Aig_ManCiNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xbe,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  if (pAig1->nObjs[3] != pAig2->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(pAig1) == Aig_ManCoNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xbf,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  if (pAig1->nRegs != pAig2->nRegs) {
    __assert_fail("Aig_ManRegNum(pAig1) == Aig_ManRegNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xc0,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  if (pAig1->nObjs[6] + pAig1->nObjs[5] != pAig2->nObjs[6] + pAig2->nObjs[5]) {
    __assert_fail("Aig_ManNodeNum(pAig1) == Aig_ManNodeNum(pAig2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                  ,0xc1,"int Iso_ManCheckMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int)");
  }
  Aig_ManCleanData(pAig1);
  pAig2->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAig1->pConst1;
  pVVar5 = pAig2->vCis;
  if (0 < pVVar5->nSize) {
    lVar3 = 0;
    do {
      if (vMap2to1->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = vMap2to1->pArray[lVar3];
      if (((long)iVar1 < 0) || (pAig1->vCis->nSize <= iVar1)) goto LAB_006e5d43;
      *(void **)((long)pVVar5->pArray[lVar3] + 0x28) = pAig1->vCis->pArray[iVar1];
      lVar3 = lVar3 + 1;
      pVVar5 = pAig2->vCis;
    } while (lVar3 < pVVar5->nSize);
  }
  pVVar5 = pAig2->vObjs;
  if (0 < pVVar5->nSize) {
    uVar7 = 0;
    do {
      pvVar2 = pVVar5->pArray[uVar7];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006e5d81;
        uVar4 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        uVar4 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pFanin1 = (Aig_Obj_t *)0x0;
        }
        else {
          pFanin1 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        pAVar6 = Aig_TableLookupTwo(pAig1,pAVar6,pFanin1);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
        if (pAVar6 == (Aig_Obj_t *)0x0) {
          if (fVerbose != 0) {
            printf("Structural equivalence failed at node %d.\n",uVar7 & 0xffffffff);
            return 0;
          }
          return 0;
        }
        pVVar5 = pAig2->vObjs;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)pVVar5->nSize);
  }
  if (pAig1->nObjs[3] - pAig1->nRegs != 1) {
    return 1;
  }
  if (0 < pAig2->vCos->nSize) {
    pvVar2 = *pAig2->vCos->pArray;
    if (((ulong)pvVar2 & 1) != 0) {
LAB_006e5d81:
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
    }
    uVar7 = *(ulong *)((long)pvVar2 + 8);
    uVar4 = uVar7 & 0xfffffffffffffffe;
    if (uVar4 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar4 + 0x28);
    }
    if (0 < pAig1->vCos->nSize) {
      if (uVar7 == *(ulong *)((long)*pAig1->vCos->pArray + 8)) {
        return 1;
      }
      if (fVerbose == 0) {
        return 0;
      }
      puts("Structural equivalence failed at primary output 0.");
      return 0;
    }
  }
LAB_006e5d43:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Iso_ManCheckMapping( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vMap2to1, int fVerbose )
{
    Aig_Obj_t * pObj, * pFanin0, * pFanin1;
    int i;
    assert( Aig_ManCiNum(pAig1) == Aig_ManCiNum(pAig2) );
    assert( Aig_ManCoNum(pAig1) == Aig_ManCoNum(pAig2) );
    assert( Aig_ManRegNum(pAig1) == Aig_ManRegNum(pAig2) );
    assert( Aig_ManNodeNum(pAig1) == Aig_ManNodeNum(pAig2) );
    Aig_ManCleanData( pAig1 );
    // map const and PI nodes
    Aig_ManConst1(pAig2)->pData = Aig_ManConst1(pAig1);
    Aig_ManForEachCi( pAig2, pObj, i )
        pObj->pData = Aig_ManCi( pAig1, Vec_IntEntry(vMap2to1, i) );
    // try internal nodes
    Aig_ManForEachNode( pAig2, pObj, i )
    {
        pFanin0 = Aig_ObjChild0Copy( pObj );
        pFanin1 = Aig_ObjChild1Copy( pObj );
        pObj->pData = Aig_TableLookupTwo( pAig1, pFanin0, pFanin1 );
        if ( pObj->pData == NULL )
        {
            if ( fVerbose )
                printf( "Structural equivalence failed at node %d.\n", i );
            return 0;
        }
    }
    // make sure the first PO points to the same node
    if ( Aig_ManCoNum(pAig1)-Aig_ManRegNum(pAig1) == 1 && Aig_ObjChild0Copy(Aig_ManCo(pAig2, 0)) != Aig_ObjChild0(Aig_ManCo(pAig1, 0)) )
    {
        if ( fVerbose )
            printf( "Structural equivalence failed at primary output 0.\n" );
        return 0;
    }
    return 1;    
}